

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::TreeEnsembleParameters::InternalSwap
          (TreeEnsembleParameters *this,TreeEnsembleParameters *other)

{
  TreeEnsembleParameters *other_local;
  TreeEnsembleParameters *this_local;
  
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->nodes_).super_RepeatedPtrFieldBase,&(other->nodes_).super_RepeatedPtrFieldBase)
  ;
  google::protobuf::RepeatedField<double>::InternalSwap
            (&this->basepredictionvalue_,&other->basepredictionvalue_);
  std::swap<unsigned_long>(&this->numpredictiondimensions_,&other->numpredictiondimensions_);
  std::swap<int>(&this->_cached_size_,&other->_cached_size_);
  return;
}

Assistant:

void TreeEnsembleParameters::InternalSwap(TreeEnsembleParameters* other) {
  nodes_.InternalSwap(&other->nodes_);
  basepredictionvalue_.InternalSwap(&other->basepredictionvalue_);
  std::swap(numpredictiondimensions_, other->numpredictiondimensions_);
  std::swap(_cached_size_, other->_cached_size_);
}